

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O3

bool __thiscall
Js::PathTypeHandlerBase::IsObjTypeSpecEquivalentHelper
          (PathTypeHandlerBase *this,Type *type,ObjectSlotAttributes *attributes,
          TypeEquivalenceRecord *record,uint *failedPropertyIndex)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  EquivalentPropertyEntry *entry;
  ulong uVar4;
  
  uVar3 = (ulong)record->propertyCount;
  bVar2 = true;
  if (uVar3 != 0) {
    entry = record->properties;
    bVar1 = IsObjTypeSpecEquivalentHelper(this,type,attributes,entry);
    uVar4 = 0;
    bVar2 = false;
    if (bVar1) {
      uVar4 = 0;
      do {
        entry = entry + 1;
        if (uVar3 - 1 == uVar4) {
          return true;
        }
        bVar2 = IsObjTypeSpecEquivalentHelper(this,type,attributes,entry);
        uVar4 = uVar4 + 1;
      } while (bVar2);
      bVar2 = uVar3 <= uVar4;
    }
    *failedPropertyIndex = (uint)uVar4;
  }
  return bVar2;
}

Assistant:

bool PathTypeHandlerBase::IsObjTypeSpecEquivalentHelper(const Type* type, const ObjectSlotAttributes * attributes, const TypeEquivalenceRecord& record, uint& failedPropertyIndex)
    {
        uint propertyCount = record.propertyCount;
        Js::EquivalentPropertyEntry* properties = record.properties;
        for (uint pi = 0; pi < propertyCount; pi++)
        {
            const EquivalentPropertyEntry* entry = &properties[pi];
            if (!this->PathTypeHandlerBase::IsObjTypeSpecEquivalentHelper(type, attributes, entry))
            {
                failedPropertyIndex = pi;
                return false;
            }
        }

        return true;
    }